

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall CGameClient::OnDemoRecSnap(CGameClient *this)

{
  CClientData *pCVar1;
  undefined8 uVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar7;
  int iVar8;
  char (*pacVar9) [97];
  long lVar10;
  int p;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  CClientData *pCVar17;
  long in_FS_OFFSET;
  char (*local_c8) [97];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  uint *puVar6;
  undefined4 extraout_var_01;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = this->m_aClients;
  pcVar15 = this->m_aClients[0].m_aClan;
  local_c8 = this->m_aClients[0].m_aaSkinPartNames;
  uVar16 = 0;
  pCVar17 = pCVar1;
  do {
    if (this->m_aClients[uVar16].m_Active == true) {
      iVar5 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])
                        (this->m_pClient,0xd,uVar16 & 0xffffffff,0xe8);
      puVar6 = (uint *)CONCAT44(extraout_var,iVar5);
      if (puVar6 == (uint *)0x0) goto LAB_0018470c;
      *puVar6 = (uint)(uVar16 == (uint)this->m_LocalClientID);
      puVar6[1] = pCVar1[uVar16].m_Team;
      iVar5 = 4;
      iVar8 = 0;
      puVar3 = puVar6 + 2;
      do {
        puVar12 = puVar3;
        local_b8 = local_b8 & 0xffffffff00000000;
        lVar14 = 0;
        do {
          if (pCVar17->m_aName[lVar14 + iVar8] == '\0') {
            iVar4 = iVar8 + (int)lVar14;
            break;
          }
          *(char *)((long)&local_b8 + lVar14) = pCVar17->m_aName[lVar14 + iVar8];
          lVar14 = lVar14 + 1;
          iVar4 = iVar8 + 4;
        } while (lVar14 != 4);
        iVar8 = iVar4;
        uVar11 = (uint)local_b8 ^ 0xffffff80;
        uVar11 = local_b8._1_1_ * 0x10000 + 0x800000U | uVar11 << 0x18;
        uVar13 = local_b8._2_1_ * 0x100 + 0x8000;
        *puVar12 = (int)local_b8._3_1_ + 0x80U | uVar13 | uVar11;
        iVar5 = iVar5 + -1;
        puVar3 = puVar12 + 1;
      } while (iVar5 != 0);
      *puVar12 = (int)local_b8._3_1_ + 0x80U & 0xffffff00 | uVar13 | uVar11;
      iVar5 = 3;
      iVar8 = 0;
      puVar3 = puVar6 + 6;
      do {
        puVar12 = puVar3;
        local_b8 = local_b8 & 0xffffffff00000000;
        lVar14 = 0;
        do {
          if (pcVar15[lVar14 + iVar8] == '\0') {
            iVar4 = iVar8 + (int)lVar14;
            break;
          }
          *(char *)((long)&local_b8 + lVar14) = pcVar15[lVar14 + iVar8];
          lVar14 = lVar14 + 1;
          iVar4 = iVar8 + 4;
        } while (lVar14 != 4);
        iVar8 = iVar4;
        uVar11 = (uint)local_b8 ^ 0xffffff80;
        uVar11 = local_b8._1_1_ * 0x10000 + 0x800000U | uVar11 << 0x18;
        uVar13 = local_b8._2_1_ * 0x100 + 0x8000;
        *puVar12 = (int)local_b8._3_1_ + 0x80U | uVar13 | uVar11;
        iVar5 = iVar5 + -1;
        puVar3 = puVar12 + 1;
      } while (iVar5 != 0);
      *puVar12 = (int)local_b8._3_1_ + 0x80U & 0xffffff00 | uVar13 | uVar11;
      puVar6[9] = pCVar1[uVar16].m_Country;
      lVar14 = 0;
      pacVar9 = local_c8;
      do {
        iVar5 = 6;
        iVar8 = 0;
        puVar3 = puVar6 + lVar14 * 6 + 10;
        do {
          puVar12 = puVar3;
          local_b8 = local_b8 & 0xffffffff00000000;
          lVar10 = 0;
          do {
            if ((*pacVar9)[lVar10 + iVar8] == '\0') {
              iVar4 = iVar8 + (int)lVar10;
              break;
            }
            *(char *)((long)&local_b8 + lVar10) = (*pacVar9)[lVar10 + iVar8];
            lVar10 = lVar10 + 1;
            iVar4 = iVar8 + 4;
          } while (lVar10 != 4);
          iVar8 = iVar4;
          uVar11 = (uint)local_b8 ^ 0xffffff80;
          uVar13 = local_b8._1_1_ * 0x10000 + 0x800000U | uVar11 << 0x18;
          uVar11 = local_b8._2_1_ * 0x100 + 0x8000;
          *puVar12 = (int)local_b8._3_1_ + 0x80U | uVar11 | uVar13;
          iVar5 = iVar5 + -1;
          puVar3 = puVar12 + 1;
        } while (iVar5 != 0);
        *puVar12 = (int)local_b8._3_1_ + 0x80U & 0xffffff00 | uVar11 | uVar13;
        puVar6[lVar14 + 0x2e] = pCVar1[uVar16].m_aUseCustomColors[lVar14];
        puVar6[lVar14 + 0x34] = pCVar1[uVar16].m_aSkinPartColors[lVar14];
        lVar14 = lVar14 + 1;
        pacVar9 = pacVar9 + 1;
      } while (lVar14 != 6);
    }
    uVar16 = uVar16 + 1;
    pCVar17 = pCVar17 + 1;
    pcVar15 = pcVar15 + 0x5b0;
    local_c8 = (char (*) [97])((long)(local_c8 + 0xf) + 1);
  } while (uVar16 != 0x40);
  local_b8 = 0xc8000003e8;
  uStack_b0 = 0x52800000032;
  local_a8 = 0x1f4000004b0;
  uStack_a0 = 0x5f00000096;
  local_98 = 0x1f4000009470;
  uStack_90 = 0x5dc0000012c;
  local_88 = 0xd6d800000032;
  uStack_80 = 0x8c00030d40;
  local_78 = 0x35b600000007d;
  uStack_70 = 0x7d000000c8;
  local_68 = 0x5000043238;
  uStack_60 = 0x2bc00000014;
  local_58 = 0xc8000186a0;
  uStack_50 = 0x3a9800013880;
  local_48 = 100;
  uStack_40 = 0x6400000064;
  iVar5 = mem_comp(&local_b8,&this->m_Tuning,0x80);
  if (iVar5 != 0) {
    iVar5 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])
                      (this->m_pClient,0xf,0,0x80);
    if ((void *)CONCAT44(extraout_var_00,iVar5) == (void *)0x0) goto LAB_0018470c;
    mem_copy((void *)CONCAT44(extraout_var_00,iVar5),&this->m_Tuning,0x80);
  }
  iVar5 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])(this->m_pClient,0xe,0,0x14);
  puVar7 = (undefined8 *)CONCAT44(extraout_var_01,iVar5);
  if (puVar7 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)&(this->m_GameInfo).m_TimeLimit;
    *puVar7 = *(undefined8 *)&this->m_GameInfo;
    puVar7[1] = uVar2;
    *(int *)(puVar7 + 2) = (this->m_GameInfo).m_MatchCurrent;
  }
LAB_0018470c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::OnDemoRecSnap()
{
	// add client info
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(!m_aClients[i].m_Active)
			continue;

		CNetObj_De_ClientInfo *pClientInfo = static_cast<CNetObj_De_ClientInfo *>(Client()->SnapNewItem(NETOBJTYPE_DE_CLIENTINFO, i, sizeof(CNetObj_De_ClientInfo)));
		if(!pClientInfo)
			return;

		pClientInfo->m_Local = i==m_LocalClientID ? 1 : 0;
		pClientInfo->m_Team = m_aClients[i].m_Team;
		StrToInts(pClientInfo->m_aName, 4, m_aClients[i].m_aName);
		StrToInts(pClientInfo->m_aClan, 3, m_aClients[i].m_aClan);
		pClientInfo->m_Country = m_aClients[i].m_Country;

		for(int p = 0; p < NUM_SKINPARTS; p++)
		{
			StrToInts(pClientInfo->m_aaSkinPartNames[p], 6, m_aClients[i].m_aaSkinPartNames[p]);
			pClientInfo->m_aUseCustomColors[p] = m_aClients[i].m_aUseCustomColors[p];
			pClientInfo->m_aSkinPartColors[p] = m_aClients[i].m_aSkinPartColors[p];
		}
	}

	// add tuning
	CTuningParams StandardTuning;
	if(mem_comp(&StandardTuning, &m_Tuning, sizeof(CTuningParams)) != 0)
	{
		CNetObj_De_TuneParams *pTuneParams = static_cast<CNetObj_De_TuneParams *>(Client()->SnapNewItem(NETOBJTYPE_DE_TUNEPARAMS, 0, sizeof(CNetObj_De_TuneParams)));
		if(!pTuneParams)
			return;

		mem_copy(pTuneParams->m_aTuneParams, &m_Tuning, sizeof(pTuneParams->m_aTuneParams));
	}

	// add game info
	CNetObj_De_GameInfo *pGameInfo = static_cast<CNetObj_De_GameInfo *>(Client()->SnapNewItem(NETOBJTYPE_DE_GAMEINFO, 0, sizeof(CNetObj_De_GameInfo)));
	if(!pGameInfo)
		return;

	pGameInfo->m_GameFlags = m_GameInfo.m_GameFlags;
	pGameInfo->m_ScoreLimit = m_GameInfo.m_ScoreLimit;
	pGameInfo->m_TimeLimit = m_GameInfo.m_TimeLimit;
	pGameInfo->m_MatchNum = m_GameInfo.m_MatchNum;
	pGameInfo->m_MatchCurrent = m_GameInfo.m_MatchCurrent;
}